

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O2

void __thiscall
primesum::BinaryIndexedTree::init<primesum::BitSieve>
          (BinaryIndexedTree *this,BitSieve *sieve,int64_t low)

{
  ulong uVar1;
  ulong *puVar2;
  pointer p_Var3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar6 = sieve->size_ >> 1;
  this->size_ = uVar6;
  std::vector<__int128,_std::allocator<__int128>_>::resize(&this->tree_,uVar6);
  p_Var3 = (this->tree_).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (sieve->sieve_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = this->size_;
  if (this->size_ < 1) {
    uVar5 = uVar6;
  }
  while (uVar6 != uVar5) {
    uVar8 = *(ulong *)(BitSieve::set_bit_ + (ulong)((int)uVar6 * 2 & 0x7e) * 8) & puVar4[uVar6 >> 6]
    ;
    if (uVar8 != 0) {
      uVar8 = low + uVar6 * 2;
    }
    uVar9 = (long)uVar8 >> 0x3f;
    puVar2 = (ulong *)(p_Var3 + uVar6);
    *(ulong *)(p_Var3 + uVar6) = uVar8;
    *(ulong *)((long)p_Var3 + uVar6 * 0x10 + 8) = uVar9;
    uVar1 = uVar6 + 1;
    uVar7 = uVar6;
    for (uVar10 = ~uVar6 & uVar1; uVar6 = uVar1, 1 < uVar10; uVar10 = uVar10 >> 1) {
      uVar6 = uVar7 - 1;
      bVar11 = CARRY8(uVar8,*(ulong *)(p_Var3 + uVar6));
      uVar8 = uVar8 + *(ulong *)(p_Var3 + uVar6);
      uVar9 = uVar9 + *(long *)((long)p_Var3 + uVar6 * 0x10 + 8) + (ulong)bVar11;
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar7 = uVar7 & uVar6;
    }
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }